

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_predict_lbd_8x16_ssse3(int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar6 [16];
  short sVar13;
  undefined1 auVar14 [16];
  
  auVar2 = pshuflw(ZEXT416((uint)alpha_q3),ZEXT416((uint)alpha_q3),0);
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar3 = pabsw(in_XMM1,auVar2);
  auVar3 = psllw(auVar3,9);
  auVar4 = pshuflw(ZEXT116(*dst),ZEXT116(*dst),0);
  uVar1 = 0xffffffffffffffc0;
  do {
    auVar6 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar1 + 0x40);
    auVar14 = psignw(auVar2,auVar6);
    auVar6 = pabsw(auVar6,auVar6);
    auVar6 = pmulhrsw(auVar6,auVar3);
    auVar6 = psignw(auVar6,auVar14);
    sVar12 = auVar4._0_2_;
    sVar5 = auVar6._0_2_ + sVar12;
    sVar13 = auVar4._2_2_;
    sVar7 = auVar6._2_2_ + sVar13;
    sVar8 = auVar6._4_2_ + sVar12;
    sVar9 = auVar6._6_2_ + sVar13;
    sVar10 = auVar6._8_2_ + sVar12;
    sVar11 = auVar6._10_2_ + sVar13;
    sVar12 = auVar6._12_2_ + sVar12;
    sVar13 = auVar6._14_2_ + sVar13;
    *(ulong *)dst =
         CONCAT17((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13),
                  CONCAT16((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12),
                           CONCAT15((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11)
                                    ,CONCAT14((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 -
                                              (0xff < sVar10),
                                              CONCAT13((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 -
                                                       (0xff < sVar9),
                                                       CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                                (char)sVar8 - (0xff < sVar8),
                                                                CONCAT11((0 < sVar7) *
                                                                         (sVar7 < 0x100) *
                                                                         (char)sVar7 -
                                                                         (0xff < sVar7),
                                                                         (0 < sVar5) *
                                                                         (sVar5 < 0x100) *
                                                                         (char)sVar5 -
                                                                         (0xff < sVar5))))))));
    dst = dst + dst_stride;
    uVar1 = uVar1 + 0x40;
  } while (uVar1 < 0x3c0);
  return;
}

Assistant:

static inline void cfl_predict_lbd_ssse3(const int16_t *pred_buf_q3,
                                         uint8_t *dst, int dst_stride,
                                         int alpha_q3, int width, int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    if (width < 16) {
      res = _mm_packus_epi16(res, res);
      if (width == 4)
        _mm_storeh_epi32((__m128i *)dst, res);
      else
        _mm_storel_epi64((__m128i *)dst, res);
    } else {
      __m128i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      res = _mm_packus_epi16(res, next);
      _mm_storeu_si128((__m128i *)dst, res);
      if (width == 32) {
        res = predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
        next = predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
        res = _mm_packus_epi16(res, next);
        _mm_storeu_si128((__m128i *)(dst + 16), res);
      }
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}